

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_application_close_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  undefined8 uStackY_80;
  undefined1 auStackY_78 [8];
  quicly_conn_t *local_70;
  ulong local_68 [2];
  quicly_application_close_frame_t *in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  size_t _l;
  quicly_conn_t *_conn;
  ushort local_38;
  int ret;
  quicly_application_close_frame_t frame;
  st_quicly_handle_payload_state_t *state_local;
  quicly_conn_t *conn_local;
  
  uStackY_80 = 0x14e8a5;
  conn_local._4_4_ =
       quicly_decode_application_close_frame
                 ((uint8_t **)_l,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (conn_local._4_4_ == 0) {
    puVar3 = auStackY_78;
    if (quicly_trace_fp != (FILE *)0x0) {
      uStackY_80 = 0x14e8f1;
      iVar2 = ptls_skip_tracing((conn->crypto).tls);
      puVar3 = auStackY_78;
      if (iVar2 == 0) {
        local_68[0] = (conn->stash).now;
        local_68[1] = (ulong)local_38;
        lVar1 = -((long)frame.reason_phrase.base * 4 + 0x10U & 0xfffffffffffffff0);
        puVar3 = auStackY_78 + lVar1;
        local_70 = conn;
        *(undefined8 *)(auStackY_78 + lVar1 + -8) = 0x14e943;
        quicly_escape_unsafe_string
                  (*(char **)(&stack0xffffffffffffffb0 + lVar1),
                   *(void **)(&stack0xffffffffffffffa8 + lVar1),
                   *(size_t *)((long)local_68 + lVar1 + 8));
        *(undefined8 *)(auStackY_78 + lVar1 + -8) = 0x14e95c;
        QUICLY_APPLICATION_CLOSE_RECEIVE
                  (*(st_quicly_conn_t **)(&stack0xffffffffffffffb0 + lVar1),
                   *(int64_t *)(&stack0xffffffffffffffa8 + lVar1),
                   *(uint64_t *)((long)local_68 + lVar1 + 8),*(char **)((long)local_68 + lVar1));
      }
    }
    *(undefined8 *)(puVar3 + -8) = 0x14e980;
    conn_local._4_4_ =
         handle_close(*(quicly_conn_t **)(puVar3 + 0x20),*(int *)(puVar3 + 0x1c),
                      *(uint64_t *)(puVar3 + 0x10),*(ptls_iovec_t *)(puVar3 + 0x28));
  }
  return conn_local._4_4_;
}

Assistant:

static int handle_application_close_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_application_close_frame_t frame;
    int ret;

    if ((ret = quicly_decode_application_close_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(APPLICATION_CLOSE_RECEIVE, conn, conn->stash.now, frame.error_code,
                 QUICLY_PROBE_ESCAPE_UNSAFE_STRING(frame.reason_phrase.base, frame.reason_phrase.len));
    return handle_close(conn, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(frame.error_code), UINT64_MAX, frame.reason_phrase);
}